

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

size_t Catch::listReporters(Config *param_1)

{
  _Rb_tree_node_base *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  Text wrapper;
  string local_e0;
  long local_c0;
  size_t local_b8;
  undefined1 *local_b0;
  TextAttributes local_a8;
  Text local_88;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Available reports:\n",0x13);
  pIVar4 = getRegistryHub();
  iVar3 = (*pIVar4->_vptr_IRegistryHub[2])(pIVar4);
  local_c0 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x18))
                       ((long *)CONCAT44(extraout_var,iVar3));
  p_Var7 = *(_Rb_tree_node_base **)(local_c0 + 0x18);
  p_Var1 = (_Rb_tree_node_base *)(local_c0 + 8);
  if (p_Var7 != p_Var1) {
    p_Var5 = p_Var7;
    p_Var8 = (_Base_ptr)0x0;
    do {
      p_Var9 = p_Var5[1]._M_parent;
      if (p_Var5[1]._M_parent < p_Var8) {
        p_Var9 = p_Var8;
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      p_Var8 = p_Var9;
    } while (p_Var5 != p_Var1);
    if (p_Var7 != p_Var1) {
      local_b0 = &p_Var9->field_0x7;
      local_b8 = 0x48 - (long)p_Var9;
      paVar2 = &local_e0.field_2;
      do {
        (**(code **)(**(long **)(p_Var7 + 2) + 0x18))(&local_e0);
        local_a8.tabChar = '\t';
        local_a8.initialIndent = 0;
        local_a8.indent = (size_t)local_b0;
        local_a8.width = local_b8;
        Text::Text(&local_88,&local_e0,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
        local_e0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_e0,((char)p_Var9 + '\x02') - (char)p_Var7[1]._M_parent);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_e0._M_dataplus._M_p,local_e0._M_string_length);
        operator<<(poVar6,&local_88);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_88.lines);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.str._M_dataplus._M_p != &local_88.str.field_2) {
          operator_delete(local_88.str._M_dataplus._M_p);
        }
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      } while (p_Var7 != p_Var1);
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  return *(size_t *)(local_c0 + 0x28);
}

Assistant:

inline void arcSafeRelease( NSObject* obj ) {
    [obj release];
}